

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_typeof(lua_State *L)

{
  long *plVar1;
  TValue *pTVar2;
  CTypeID CVar3;
  void *pvVar4;
  ulong uVar5;
  CTState *cts;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  CVar3 = ffi_checkctype(L,cts,L->base + 1);
  pvVar4 = lj_mem_newgco(cts->L,0xc);
  *(undefined1 *)((long)pvVar4 + 5) = 10;
  *(undefined2 *)((long)pvVar4 + 6) = 0x15;
  plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
  *plVar1 = *plVar1 + 1;
  *(CTypeID *)((long)pvVar4 + 8) = CVar3;
  pTVar2 = L->top;
  pTVar2[-1].u32.lo = (uint32_t)pvVar4;
  *(undefined4 *)((long)pTVar2 + -4) = 0xfffffff5;
  uVar5 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar5 + 0x54) <= *(uint *)(uVar5 + 0x50)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_typeof)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, L->base+1);
  GCcdata *cd = lj_cdata_new(cts, CTID_CTYPEID, 4);
  *(CTypeID *)cdataptr(cd) = id;
  setcdataV(L, L->top-1, cd);
  lj_gc_check(L);
  return 1;
}